

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O3

void __thiscall Bipartition::Bipartition(Bipartition *this)

{
  pointer puVar1;
  bool bVar2;
  allocator<unsigned_long> local_39;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  this->_vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__0013ea08;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition).m_num_bits = 0;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_38,0,0,&local_39);
  if (&local_38 != &this->partition) {
    puVar1 = (this->partition).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->partition).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 == (pointer)0x0) {
      (this->partition).m_num_bits = local_38.m_num_bits;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      operator_delete(puVar1);
      puVar1 = local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      (this->partition).m_num_bits = local_38.m_num_bits;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if (local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("(b.m_bits = buffer_type()).empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x2a2,
                        "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
      }
    }
    local_38.m_num_bits = 0;
  }
  bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_38);
  if (bVar2) {
    if (local_38.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("m_check_invariants()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x279,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

Bipartition::Bipartition() {
    partition = boost::dynamic_bitset<>(0);
}